

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O2

Token * __thiscall GetOpt::GetOpt_pp::_add_token(GetOpt_pp *this,string *value,Type type)

{
  Token *this_00;
  Token **ppTVar1;
  
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,value,type);
  ppTVar1 = &this->_last_token->next;
  if (this->_first_token == (Token *)0x0) {
    ppTVar1 = &this->_first_token;
  }
  *ppTVar1 = this_00;
  this->_last_token = this_00;
  return this_00;
}

Assistant:

GETOPT_INLINE Token* GetOpt_pp::_add_token(const std::string& value, Token::Type type)
{
    Token* const ret = new Token(value, type);
    if (_first_token == NULL)
        _first_token = ret;
    else
        _last_token->link_to(ret);
    _last_token = ret;
    return ret;
}